

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmExternalMakefileProjectGenerator.cxx
# Opt level: O0

string * __thiscall
cmExternalMakefileProjectGeneratorFactory::GetDocumentation_abi_cxx11_
          (string *__return_storage_ptr__,cmExternalMakefileProjectGeneratorFactory *this)

{
  cmExternalMakefileProjectGeneratorFactory *this_local;
  
  std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)&this->Documentation);
  return __return_storage_ptr__;
}

Assistant:

std::string cmExternalMakefileProjectGeneratorFactory::GetDocumentation() const
{
  return this->Documentation;
}